

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# muse.c
# Opt level: O1

int use_misc(monst *mtmp,musable *m)

{
  byte bVar1;
  monuse mVar2;
  obj *poVar3;
  level *plVar4;
  boolean bVar5;
  schar sVar6;
  xchar tolev;
  int iVar7;
  uint uVar8;
  char *pcVar9;
  trap *trap;
  char *pcVar10;
  char *pcVar11;
  permonst *ppVar12;
  undefined8 uVar13;
  bool bVar14;
  bool bVar15;
  char nambuf [256];
  d_level adStack_138 [132];
  
  poVar3 = m->misc;
  iVar7 = precheck(mtmp,poVar3,m);
  if (iVar7 != 0) {
    return iVar7;
  }
  bVar1 = viz_array[mtmp->my][mtmp->mx];
  if (mtmp->wormno == '\0') {
    if ((bVar1 & 2) == 0) {
      if ((((u.uprops[0x1e].intrinsic != 0) ||
           (((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)) ||
            (((youmonst.data)->mflags1 & 0x1000) != 0)))) &&
          ((ublindf == (obj *)0x0 || (ublindf->oartifact != '\x1d')))) ||
         ((u.uprops[0x40].extrinsic == 0 && u.uprops[0x40].intrinsic == 0 &&
          (((youmonst.data)->mflags3 & 0x100) == 0)))) goto LAB_001fb54c;
      bVar15 = false;
      if (((mtmp->data->mflags3 & 0x200) == 0) || ((bVar1 & 1) == 0)) goto LAB_001fb54f;
    }
LAB_001fb4f3:
    uVar8 = *(uint *)&mtmp->field_0x60;
    if ((((uVar8 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) || (u.uprops[0xc].extrinsic != 0)) {
      if ((char)uVar8 < '\0') goto LAB_001fb54c;
    }
    else {
      bVar15 = false;
      if (((char)uVar8 < '\0') || (((youmonst.data)->mflags1 & 0x1000000) == 0)) goto LAB_001fb54f;
    }
    bVar15 = (u._1052_1_ & 0x20) == 0 && (uVar8 >> 9 & 1) == 0;
  }
  else {
    bVar5 = worm_known(level,mtmp);
    if (bVar5 != '\0') goto LAB_001fb4f3;
LAB_001fb54c:
    bVar15 = false;
  }
LAB_001fb54f:
  mVar2 = m->has_misc;
  if (8 < mVar2 - MUSE_POT_GAIN_LEVEL) {
    if (mVar2 != MUSE_NONE) {
      pcVar9 = Monnam(mtmp);
      warning("%s wanted to perform action %d?",pcVar9,(ulong)m->has_misc);
      return 0;
    }
    return 0;
  }
  bVar14 = (bool)(poVar3 != (obj *)0x0 & bVar15);
  switch(mVar2) {
  case MUSE_POT_GAIN_LEVEL:
    mquaffmsg(mtmp,poVar3);
    if ((poVar3->field_0x4a & 1) == 0) {
      if (bVar15) {
        pcVar9 = Monnam(mtmp);
        pline("%s seems more experienced.",pcVar9);
      }
      if (bVar14) {
        discover_object(299,'\x01','\x01');
      }
      m_useup(mtmp,poVar3);
      ppVar12 = grow_up(mtmp,(monst *)0x0);
      return 2 - (uint)(ppVar12 == (permonst *)0x0);
    }
    bVar5 = Can_rise_up(level,(int)mtmp->mx,(int)mtmp->my);
    if (bVar5 != '\0') {
      sVar6 = depth(&u.uz);
      get_level(adStack_138,sVar6 + -1);
      bVar5 = on_level(adStack_138,&u.uz);
      if (bVar5 == '\0') {
        if (bVar15) {
          pcVar9 = Monnam(mtmp);
          pcVar10 = ceiling((int)mtmp->mx,(int)mtmp->my);
          pline("%s rises up, through the %s!",pcVar9,pcVar10);
          if (((objects[299].field_0x10 & 1) == 0) && (objects[299].oc_uname == (char *)0x0)) {
            docall(poVar3);
          }
        }
        m_useup(mtmp,poVar3);
        tolev = ledger_no(adStack_138);
        migrate_to_level(mtmp,tolev,'\0',(coord *)0x0);
        return 2;
      }
    }
    if (bVar15) {
      pcVar9 = Monnam(mtmp);
      pline("%s looks uneasy.",pcVar9);
      if (((objects[299].field_0x10 & 1) == 0) && (objects[299].oc_uname == (char *)0x0)) {
        docall(poVar3);
      }
    }
    break;
  default:
    if (poVar3->otyp == 0x1c5) {
      mzapmsg(mtmp,poVar3,'\x01');
      poVar3->spe = poVar3->spe + -1;
    }
    else {
      mquaffmsg(mtmp,poVar3);
    }
    if ((u.uprops[0xc].extrinsic == 0 && u.uprops[0xc].intrinsic == 0) &&
       (((youmonst.data)->mflags1 & 0x1000000) == 0)) {
      pcVar9 = mon_nam(mtmp);
    }
    else {
      pcVar9 = Monnam(mtmp);
    }
    strcpy(&adStack_138[0].dnum,pcVar9);
    mon_set_minvis(mtmp);
    if ((bVar15) && ((mtmp->field_0x60 & 2) != 0)) {
      if ((u.uprops[0xc].extrinsic == 0 && u.uprops[0xc].intrinsic == 0) &&
         (((youmonst.data)->mflags1 & 0x1000000) == 0)) {
        pline("Suddenly you cannot see %s.",adStack_138);
      }
      else {
        pcVar9 = s_suffix(&adStack_138[0].dnum);
        pcVar10 = "strange";
        if ((u.uprops[0x23].intrinsic != 0) && (u.uprops[0x24].extrinsic == 0)) {
          if (u.umonnum == u.umonster) {
            pcVar10 = "normal";
          }
          else {
            bVar5 = dmgtype(youmonst.data,0x24);
            pcVar10 = "strange";
            if (bVar5 == '\0') {
              pcVar10 = "normal";
            }
          }
        }
        pline("%s body takes on a %s transparency.",pcVar9,pcVar10);
      }
      if (bVar14) {
        discover_object((int)poVar3->otyp,'\x01','\x01');
      }
    }
    if (poVar3->otyp == 0x135) {
      if ((poVar3->field_0x4a & 1) != 0) {
        you_aggravate(mtmp);
      }
      m_useup(mtmp,poVar3);
      return 2;
    }
    return 2;
  case MUSE_POLY_TRAP:
    if (bVar15) {
      pcVar9 = Monnam(mtmp);
      pcVar10 = locomotion(mtmp->data,"jump");
      pcVar10 = makeplural(pcVar10);
      pline("%s deliberately %s onto a polymorph trap!",pcVar9,pcVar10);
    }
    if ((bVar1 & 2) != 0) {
      trap = t_at(level,trapx,trapy);
      seetrap(trap);
    }
    remove_monster(level,(int)mtmp->mx,(int)mtmp->my);
    newsym((int)mtmp->mx,(int)mtmp->my);
    place_monster(mtmp,trapx,trapy);
    if (mtmp->wormno != '\0') {
      worm_move(mtmp);
    }
    newsym(trapx,trapy);
    newcham(level,mtmp,(permonst *)0x0,'\0','\0');
    return 2;
  case MUSE_WAN_POLYMORPH:
    mzapmsg(mtmp,poVar3,'\x01');
    poVar3->spe = poVar3->spe + -1;
    plVar4 = level;
    ppVar12 = muse_newcham_mon(mtmp);
    newcham(plVar4,mtmp,ppVar12,'\x01','\0');
    if (bVar14) {
      discover_object(0x1c9,'\x01','\x01');
      return 2;
    }
    return 2;
  case MUSE_POT_SPEED:
    mquaffmsg(mtmp,poVar3);
    mon_adjust_speed(mtmp,1,poVar3);
    break;
  case MUSE_WAN_SPEED_MONSTER:
    mzapmsg(mtmp,poVar3,'\x01');
    poVar3->spe = poVar3->spe + -1;
    mon_adjust_speed(mtmp,1,poVar3);
    return 2;
  case MUSE_BULLWHIP:
    if (uwep == (obj *)0x0) {
      return 0;
    }
    uVar8 = mt_random();
    if (uVar8 * -0x33333333 < 0x33333334) {
      pcVar9 = "A whip";
      if (bVar15) {
        pcVar9 = "The bullwhip";
      }
      uVar8 = mt_random();
      poVar3 = uwep;
      pcVar10 = xname(uwep);
      pcVar10 = the(pcVar10);
      strcpy(&adStack_138[0].dnum,pcVar10);
      pcVar10 = body_part(6);
      if (((byte)(poVar3->oclass | 4U) == 6) && ((objects[poVar3->otyp].field_0x11 & 1) != 0)) {
        pcVar10 = makeplural(pcVar10);
      }
      if (bVar15) {
        pcVar11 = Monnam(mtmp);
        pline("%s flicks a bullwhip towards your %s!",pcVar11,pcVar10);
      }
      if (poVar3->otyp == 0x216) {
        pline("%s fails to wrap around %s.",pcVar9,adStack_138);
      }
      else {
        pline("%s wraps around %s you\'re wielding!",pcVar9,adStack_138);
        iVar7 = welded(poVar3);
        if (iVar7 == 0) {
          uVar8 = uVar8 & 3;
        }
        else {
          if (poVar3->quan < 2) {
            pcVar9 = "It is";
            if (poVar3->oartifact == '\x1d') {
              pcVar9 = "They are";
            }
          }
          else {
            pcVar9 = "They are";
          }
          uVar13 = 0x2e;
          if ((poVar3->field_0x4a & 0x40) == 0) {
            uVar13 = 0x21;
          }
          uVar8 = 0;
          pline("%s welded to your %s%c",pcVar9,pcVar10,uVar13);
        }
        if (uVar8 == 3) {
          bVar5 = hates_silver(mtmp->data);
          if (bVar5 == '\0') {
            uVar8 = 3;
          }
          else {
            uVar8 = (*(ushort *)&objects[poVar3->otyp].field_0x11 & 0x1f0) == 0xe0 ^ 3;
          }
        }
        else if (uVar8 == 0) {
          pline("The whip slips free.");
          return 1;
        }
        freeinv(poVar3);
        uwepgone();
        if (uVar8 == 3) {
          pcVar9 = Monnam(mtmp);
          pline("%s snatches %s!",pcVar9,adStack_138);
          mpickobj(mtmp,poVar3);
        }
        else if (uVar8 == 2) {
          pcVar9 = Monnam(mtmp);
          pcVar10 = surface((int)u.ux,(int)u.uy);
          pline("%s yanks %s to the %s!",pcVar9,adStack_138,pcVar10);
          dropy(poVar3);
        }
        else if (uVar8 == 1) {
          pcVar9 = Monnam(mtmp);
          pline("%s yanks %s from your %s!",pcVar9,adStack_138,pcVar10);
          place_object(poVar3,level,(int)mtmp->mx,(int)mtmp->my);
        }
      }
      return 1;
    }
    return 0;
  case MUSE_POT_POLYMORPH:
    mquaffmsg(mtmp,poVar3);
    if (bVar15) {
      pcVar9 = Monnam(mtmp);
      pline("%s suddenly mutates!",pcVar9);
    }
    plVar4 = level;
    ppVar12 = muse_newcham_mon(mtmp);
    newcham(plVar4,mtmp,ppVar12,'\0','\0');
    if (bVar14) {
      discover_object(0x13a,'\x01','\x01');
    }
  }
  m_useup(mtmp,poVar3);
  return 2;
}

Assistant:

int use_misc(struct monst *mtmp, struct musable *m)
{
	int i;
	struct obj *otmp = m->misc;
	boolean vis, vismon, oseen;
	char nambuf[BUFSZ];

	if ((i = precheck(mtmp, otmp, m)) != 0) return i;
	vis = cansee(mtmp->mx, mtmp->my);
	vismon = canseemon(level, mtmp);
	oseen = otmp && vismon;

	switch(m->has_misc) {
	case MUSE_POT_GAIN_LEVEL:
		mquaffmsg(mtmp, otmp);
		if (otmp->cursed) {
		    if (Can_rise_up(level, mtmp->mx, mtmp->my)) {
			int tolev = depth(&u.uz)-1;
			d_level tolevel;

			get_level(&tolevel, tolev);
			/* insurance against future changes... */
			if (on_level(&tolevel, &u.uz)) goto skipmsg;
			if (vismon) {
			    pline("%s rises up, through the %s!",
				  Monnam(mtmp), ceiling(mtmp->mx, mtmp->my));
			    if (!objects[POT_GAIN_LEVEL].oc_name_known
			      && !objects[POT_GAIN_LEVEL].oc_uname)
				docall(otmp);
			}
			m_useup(mtmp, otmp);
			migrate_to_level(mtmp, ledger_no(&tolevel),
					 MIGR_RANDOM, NULL);
			return 2;
		    } else {
skipmsg:
			if (vismon) {
			    pline("%s looks uneasy.", Monnam(mtmp));
			    if (!objects[POT_GAIN_LEVEL].oc_name_known
			      && !objects[POT_GAIN_LEVEL].oc_uname)
				docall(otmp);
			}
			m_useup(mtmp, otmp);
			return 2;
		    }
		}
		if (vismon) pline("%s seems more experienced.", Monnam(mtmp));
		if (oseen) makeknown(POT_GAIN_LEVEL);
		m_useup(mtmp, otmp);
		if (!grow_up(mtmp,NULL)) return 1;
			/* grew into genocided monster */
		return 2;
	case MUSE_WAN_MAKE_INVISIBLE:
	case MUSE_POT_INVISIBILITY:
		if (otmp->otyp == WAN_MAKE_INVISIBLE) {
		    mzapmsg(mtmp, otmp, TRUE);
		    otmp->spe--;
		} else
		    mquaffmsg(mtmp, otmp);
		/* format monster's name before altering its visibility */
		strcpy(nambuf, See_invisible ? Monnam(mtmp) : mon_nam(mtmp));
		mon_set_minvis(mtmp);
		if (vismon && mtmp->minvis) {	/* was seen, now invisible */
		    if (See_invisible)
			pline("%s body takes on a %s transparency.",
			      s_suffix(nambuf),
			      Hallucination ? "normal" : "strange");
		    else
			pline("Suddenly you cannot see %s.", nambuf);
		    if (oseen) makeknown(otmp->otyp);
		}
		if (otmp->otyp == POT_INVISIBILITY) {
		    if (otmp->cursed) you_aggravate(mtmp);
		    m_useup(mtmp, otmp);
		}
		return 2;
	case MUSE_WAN_SPEED_MONSTER:
		mzapmsg(mtmp, otmp, TRUE);
		otmp->spe--;
		mon_adjust_speed(mtmp, 1, otmp);
		return 2;
	case MUSE_POT_SPEED:
		mquaffmsg(mtmp, otmp);
		/* note difference in potion effect due to substantially
		   different methods of maintaining speed ratings:
		   player's character becomes "very fast" temporarily;
		   monster becomes "one stage faster" permanently */
		mon_adjust_speed(mtmp, 1, otmp);
		m_useup(mtmp, otmp);
		return 2;
	case MUSE_WAN_POLYMORPH:
		mzapmsg(mtmp, otmp, TRUE);
		otmp->spe--;
		newcham(level, mtmp, muse_newcham_mon(mtmp), TRUE, FALSE);
		if (oseen) makeknown(WAN_POLYMORPH);
		return 2;
	case MUSE_POT_POLYMORPH:
		mquaffmsg(mtmp, otmp);
		if (vismon) pline("%s suddenly mutates!", Monnam(mtmp));
		newcham(level, mtmp, muse_newcham_mon(mtmp), FALSE, FALSE);
		if (oseen) makeknown(POT_POLYMORPH);
		m_useup(mtmp, otmp);
		return 2;
	case MUSE_POLY_TRAP:
		if (vismon)
		    pline("%s deliberately %s onto a polymorph trap!",
			Monnam(mtmp),
			makeplural(locomotion(mtmp->data, "jump")));
		if (vis) seetrap(t_at(level, trapx,trapy));

		/*  don't use rloc() due to worms */
		remove_monster(level, mtmp->mx, mtmp->my);
		newsym(mtmp->mx, mtmp->my);
		place_monster(mtmp, trapx, trapy);
		if (mtmp->wormno) worm_move(mtmp);
		newsym(trapx, trapy);

		newcham(level, mtmp, NULL, FALSE, FALSE);
		return 2;
	case MUSE_BULLWHIP:
		/* attempt to disarm hero */
		if (uwep && !rn2(5)) {
		    const char *The_whip = vismon ? "The bullwhip" : "A whip";
		    int where_to = rn2(4);
		    struct obj *obj = uwep;
		    const char *hand;
		    char the_weapon[BUFSZ];

		    strcpy(the_weapon, the(xname(obj)));
		    hand = body_part(HAND);
		    if (bimanual(obj)) hand = makeplural(hand);

		    if (vismon)
			pline("%s flicks a bullwhip towards your %s!",
			      Monnam(mtmp), hand);
		    if (obj->otyp == HEAVY_IRON_BALL) {
			pline("%s fails to wrap around %s.",
			      The_whip, the_weapon);
			return 1;
		    }
		    pline("%s wraps around %s you're wielding!",
			  The_whip, the_weapon);
		    if (welded(obj)) {
			pline("%s welded to your %s%c",
			      !is_plural(obj) ? "It is" : "They are",
			      hand, !obj->bknown ? '!' : '.');
			/* obj->bknown = 1; */ /* welded() takes care of this */
			where_to = 0;
		    }
		    if (!where_to) {
			pline("The whip slips free.");  /* not `The_whip' */
			return 1;
		    } else if (where_to == 3 && hates_silver(mtmp->data) &&
			    objects[obj->otyp].oc_material == SILVER) {
			/* this monster won't want to catch a silver
			   weapon; drop it at hero's feet instead */
			where_to = 2;
		    }
		    freeinv(obj);
		    uwepgone();
		    switch (where_to) {
			case 1:		/* onto floor beneath mon */
			    pline("%s yanks %s from your %s!", Monnam(mtmp),
				  the_weapon, hand);
			    place_object(obj, level, mtmp->mx, mtmp->my);
			    break;
			case 2:		/* onto floor beneath you */
			    pline("%s yanks %s to the %s!", Monnam(mtmp),
				  the_weapon, surface(u.ux, u.uy));
			    dropy(obj);
			    break;
			case 3:		/* into mon's inventory */
			    pline("%s snatches %s!", Monnam(mtmp),
				  the_weapon);
			    mpickobj(mtmp,obj);
			    break;
		    }
		    return 1;
		}
		return 0;
	case 0: return 0; /* i.e. an exploded wand */
	default: warning("%s wanted to perform action %d?", Monnam(mtmp),
			 m->has_misc);
		break;
	}
	return 0;
}